

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void lantern_message(obj *obj)

{
  char cVar1;
  boolean bVar2;
  char *pcVar3;
  
  cVar1 = obj->where;
  if (cVar1 == '\x01') {
    pcVar3 = "You see a lantern getting dim.";
  }
  else {
    if (cVar1 == '\x04') {
      pcVar3 = Monnam((obj->v).v_ocarry);
      pcVar3 = s_suffix(pcVar3);
      pline("%s lantern is getting dim.",pcVar3);
      goto LAB_0025eac6;
    }
    if (cVar1 != '\x03') {
      return;
    }
    pline("Your lantern is getting dim.");
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0'))))
    goto LAB_0025eac6;
    pcVar3 = "Batteries have not been invented yet.";
  }
  pline(pcVar3);
LAB_0025eac6:
  obj->field_0x4a = obj->field_0x4a | 0x10;
  return;
}

Assistant:

static void lantern_message(struct obj *obj)
{
	/* from adventure */
	switch (obj->where) {
	    case OBJ_INVENT:
		pline("Your lantern is getting dim.");
		if (Hallucination)
		    pline("Batteries have not been invented yet.");
		break;
	    case OBJ_FLOOR:
		pline("You see a lantern getting dim.");
		break;
	    case OBJ_MINVENT:
		pline("%s lantern is getting dim.",
		    s_suffix(Monnam(obj->ocarry)));
		break;
	    default:
		return;
	}
	obj->known = 1;
}